

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O2

void duckdb::CurrentDatabaseFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  ClientContext *context;
  string *psVar1;
  Value val;
  string local_70;
  Value local_50;
  
  context = ExpressionState::GetContext(state);
  psVar1 = DatabaseManager::GetDefaultDatabase_abi_cxx11_(context);
  ::std::__cxx11::string::string((string *)&local_70,(string *)psVar1);
  Value::Value(&local_50,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  Vector::Reference(result,&local_50);
  Value::~Value(&local_50);
  return;
}

Assistant:

static void CurrentDatabaseFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	Value val(DatabaseManager::GetDefaultDatabase(state.GetContext()));
	result.Reference(val);
}